

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O1

Linear<std::__cxx11::basic_string<char>,_double> * __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
::_generate_linear(Linear<std::__cxx11::basic_string<char>,_double> *__return_storage_ptr__,
                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                  *this)

{
  int iVar1;
  StorageIndex *pSVar2;
  StorageIndex *pSVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  pointer pbVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  Scalar SVar14;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  pbVar10 = (this->_idx_to_label).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->_idx_to_label).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10;
  if (uVar4 != 0) {
    uVar6 = (long)uVar4 >> 5;
    uVar13 = 0;
    do {
      if ((((long)uVar6 < 0) || ((this->_quadmat).m_outerSize <= (long)uVar13)) ||
         ((this->_quadmat).m_innerSize <= (long)uVar6)) {
        __assert_fail("row>=0 && row<rows() && col>=0 && col<cols()",
                      "/usr/include/eigen3/Eigen/src/SparseCore/SparseMatrix.h",0xc0,
                      "Scalar Eigen::SparseMatrix<double, 1>::coeff(Index, Index) const [_Scalar = double, _Options = 1, _StorageIndex = int]"
                     );
      }
      pSVar2 = (this->_quadmat).m_innerNonZeros;
      if (pSVar2 == (StorageIndex *)0x0) {
        iVar8 = (this->_quadmat).m_outerIndex[uVar13 + 1];
      }
      else {
        iVar8 = pSVar2[uVar13] + (this->_quadmat).m_outerIndex[uVar13];
      }
      iVar1 = (this->_quadmat).m_outerIndex[uVar13];
      lVar7 = (long)iVar1;
      SVar14 = 0.0;
      if (iVar1 < iVar8) {
        lVar9 = (long)iVar8;
        iVar8 = (int)(uVar4 >> 5);
        pSVar3 = (this->_quadmat).m_data.m_indices;
        lVar12 = lVar9 + -1;
        if (iVar8 != pSVar3[lVar9 + -1]) {
          while (lVar11 = lVar12, lVar7 < lVar11) {
            lVar12 = lVar11 + lVar7 >> 1;
            if (pSVar3[lVar12] < iVar8) {
              lVar7 = lVar12 + 1;
              lVar12 = lVar11;
            }
          }
          if ((lVar9 <= lVar7) || (lVar12 = lVar7, iVar8 != pSVar3[lVar7])) goto LAB_0014d55e;
        }
        SVar14 = (this->_quadmat).m_data.m_values[lVar12];
      }
LAB_0014d55e:
      if ((SVar14 != 0.0) || (NAN(SVar14))) {
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)__return_storage_ptr__,pbVar10 + uVar13);
        *pmVar5 = SVar14;
      }
      uVar13 = uVar13 + 1;
      pbVar10 = (this->_idx_to_label).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(this->_idx_to_label).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10;
      uVar6 = (long)uVar4 >> 5;
    } while (uVar13 < uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Linear<IndexType, FloatType> _generate_linear() const {
      Linear<IndexType, FloatType> ret_linear;
      for ( size_t i = 0; i < _idx_to_label.size(); i++ ) {
        FloatType val = _quadmat_get( i, _idx_to_label.size() );
        if ( val != 0 )
          ret_linear[ _idx_to_label[ i ] ] = val;
      }

      return ret_linear;
    }